

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThree.cpp
# Opt level: O3

string * __thiscall
GreenRoomThree::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,GreenRoomThree *this,bool longform)

{
  itemLocation iVar1;
  undefined8 in_RAX;
  ItemWrapper *this_00;
  undefined7 in_register_00000011;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uStack_18;
  
  if ((int)CONCAT71(in_register_00000011,longform) == 0) {
    uStack_18 = CONCAT44(0x13,(int)in_RAX);
    this_00 = ItemTable::getValue((this->super_Room).table,(itemType *)((long)&uStack_18 + 4));
    iVar1 = ItemWrapper::getLocation(this_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == ACTIVE) {
      pcVar3 = (this->super_Room).rstate2._M_dataplus._M_p;
      sVar2 = (this->super_Room).rstate2._M_string_length;
    }
    else {
      pcVar3 = (this->super_Room).rstate1._M_dataplus._M_p;
      sVar2 = (this->super_Room).rstate1._M_string_length;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->super_Room).rstate0._M_dataplus._M_p;
    sVar2 = (this->super_Room).rstate0._M_string_length;
    uStack_18 = in_RAX;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GreenRoomThree::getDescription(bool longform) {
    if(longform){
        return rstate0;
    }
    if(table->getValue(CLEAN_BUCKET)->getLocation() == ACTIVE) {
        return rstate2;
    }
    return rstate1;
}